

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadExtend<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<unsigned_char,(unsigned_char)8>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  byte bVar1;
  Simd<unsigned_short,_(unsigned_char)__b_> value;
  RunResult RVar2;
  byte *pbVar3;
  unsigned_short *puVar4;
  byte local_51;
  undefined1 auStack_50 [7];
  u8 i;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  Simd<unsigned_char,_(unsigned_char)__b_> local_28;
  Simd<unsigned_char,_(unsigned_char)__b_> val;
  Ptr *out_trap_local;
  Thread *this_local;
  
  result.v._8_8_ = instr._0_8_;
  val.v = (uchar  [8])out_trap;
  RVar2 = Load<wabt::interp::Simd<unsigned_char,(unsigned_char)8>>(this,instr,&local_28,out_trap);
  if (RVar2 == Ok) {
    for (local_51 = 0; local_51 < 8; local_51 = local_51 + 1) {
      pbVar3 = Simd<unsigned_char,_(unsigned_char)'\b'>::operator[](&local_28,local_51);
      bVar1 = *pbVar3;
      puVar4 = Simd<unsigned_short,_(unsigned_char)'\b'>::operator[]
                         ((Simd<unsigned_short,_(unsigned_char)__b_> *)auStack_50,local_51);
      *puVar4 = (ushort)bVar1;
    }
    value.v[4] = result.v[0];
    value.v[5] = result.v[1];
    value.v[6] = result.v[2];
    value.v[7] = result.v[3];
    value.v[0] = auStack_50._0_2_;
    value.v[1] = auStack_50._2_2_;
    value.v[2] = auStack_50._4_2_;
    value.v[3] = stack0xffffffffffffffb6;
    Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,value);
    this_local._4_4_ = Ok;
  }
  else {
    this_local._4_4_ = Trap;
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoSimdLoadExtend(Instr instr, Trap::Ptr* out_trap) {
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = val[i];
  }
  Push(result);
  return RunResult::Ok;
}